

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llvm::yaml::Input::keys
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          Input *this)

{
  pointer *ppSVar1;
  uint uVar2;
  HNode *hnode;
  _func_int **pp_Var3;
  iterator __position;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  Child local_40;
  size_t sStack_38;
  
  hnode = this->CurrentNode;
  if (hnode == (HNode *)0x0) {
    __assert_fail("Val && \"isa<> used on a null pointer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                  ,0x69,
                  "static bool llvm::isa_impl_cl<llvm::yaml::Input::MapHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::MapHNode, From = const llvm::yaml::Input::HNode *]"
                 );
  }
  uVar2 = hnode->_node->TypeID;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar2 == 4) {
    pp_Var3 = hnode[1]._vptr_HNode;
    uVar2 = *(uint *)&hnode[1]._node;
    pp_Var5 = pp_Var3;
    if ((ulong)uVar2 != 0) {
      for (; (*pp_Var5 == (_func_int *)0x0 || (*pp_Var5 == (_func_int *)0xfffffffffffffff8));
          pp_Var5 = pp_Var5 + 1) {
      }
    }
    if (pp_Var5 != pp_Var3 + uVar2) {
      p_Var4 = *pp_Var5;
      do {
        sStack_38 = *(size_t *)p_Var4;
        local_40.decUL = (unsigned_long *)(p_Var4 + 0x10);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
          _M_realloc_insert<llvm::StringRef>
                    (__return_storage_ptr__,__position,(StringRef *)&local_40);
        }
        else {
          (__position._M_current)->Data = (char *)local_40;
          (__position._M_current)->Length = sStack_38;
          ppSVar1 = &(__return_storage_ptr__->
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        do {
          do {
            pp_Var5 = pp_Var5 + 1;
            p_Var4 = *pp_Var5;
          } while (p_Var4 == (_func_int *)0x0);
        } while (p_Var4 == (_func_int *)0xfffffffffffffff8);
      } while (pp_Var5 != pp_Var3 + uVar2);
    }
  }
  else {
    Twine::Twine((Twine *)&local_40,"not a mapping");
    setError(this,hnode,(Twine *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> Input::keys() {
  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  std::vector<StringRef> Ret;
  if (!MN) {
    setError(CurrentNode, "not a mapping");
    return Ret;
  }
  for (auto &P : MN->Mapping)
    Ret.push_back(P.first());
  return Ret;
}